

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_Fill_Test::TestBody(FormatterTest_Fill_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_15;
  undefined1 local_318 [32];
  undefined8 local_2f8;
  _Alloc_hider local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  undefined1 *local_2b8;
  long lStack_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [504];
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58 [2];
  undefined8 local_48 [3];
  
  testing::AssertionSuccess();
  pAVar1 = (AssertHelperData *)(local_318 + 0x10);
  if ((char)local_2e8._M_dataplus._M_p == '\x01') {
    local_318._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"invalid fill character \'{\'","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 99;
      lStack_2b0 = 0;
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_2a8 = 500;
      format_str.size_ = 7;
      format_str.data_ = "{0:{<5}";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
                    ::TYPES;
      local_2b8 = local_2a0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2c0,format_str,args,(locale_ref)0x0);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,local_2b8,local_2b8 + lStack_2b0);
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_2b8 != local_2a0) {
        operator_delete(local_2b8);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_2e8,
               (char (*) [104])
               "Expected: format(\"{0:{<5}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
      operator_delete((void *)local_318._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2c0);
  if ((undefined8 *)
      CONCAT62(local_2e8._M_string_length._2_6_,(undefined2)local_2e8._M_string_length) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_2e8._M_string_length._2_6_,
                                (undefined2)local_2e8._M_string_length);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_318,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3a3,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
  if (local_2c0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
    }
    local_2c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_2e8._M_dataplus._M_p == '\x01') {
    local_318._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"invalid fill character \'{\'","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_48[0] = 99;
      lStack_2b0 = 0;
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_2a8 = 500;
      format_str_00.size_ = 8;
      format_str_00.data_ = "{0:{<5}}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_2b8 = local_2a0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2c0,format_str_00,args_00,(locale_ref)0x0);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,local_2b8,local_2b8 + lStack_2b0);
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_2b8 != local_2a0) {
        operator_delete(local_2b8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_2e8,
               (char (*) [105])
               "Expected: format(\"{0:{<5}}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
      operator_delete((void *)local_318._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2c0);
  if ((undefined8 *)
      CONCAT62(local_2e8._M_string_length._2_6_,(undefined2)local_2e8._M_string_length) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_2e8._M_string_length._2_6_,
                                (undefined2)local_2e8._M_string_length);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_318,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3a5,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
  if (local_2c0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
    }
    local_2c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = &DAT_0000002a;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_01.size_ = 7;
  format_str_01.data_ = "{0:*>4}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_01,args_01,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**42\"","format(\"{0:*>4}\", 42)",(char (*) [5])0x23ecc4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = &DAT_ffffffd6;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_02.size_ = 7;
  format_str_02.data_ = "{0:*>5}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_02,args_02,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**-42\"","format(\"{0:*>5}\", -42)",(char (*) [6])"**-42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = &DAT_0000002a;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_03.size_ = 7;
  format_str_03.data_ = "{0:*>5}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_03,args_03,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"***42\"","format(\"{0:*>5}\", 42u)",(char (*) [6])"***42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0xffffffffffffffd6;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_04.size_ = 7;
  format_str_04.data_ = "{0:*>5}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_04,args_04,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**-42\"","format(\"{0:*>5}\", -42l)",(char (*) [6])"**-42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3a9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = &DAT_0000002a;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_05.size_ = 7;
  format_str_05.data_ = "{0:*>5}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_05,args_05,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"***42\"","format(\"{0:*>5}\", 42ul)",(char (*) [6])"***42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3aa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0xffffffffffffffd6;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_06.size_ = 7;
  format_str_06.data_ = "{0:*>5}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_06,args_06,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**-42\"","format(\"{0:*>5}\", -42ll)",(char (*) [6])"**-42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = &DAT_0000002a;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_07.size_ = 7;
  format_str_07.data_ = "{0:*>5}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_07,args_07,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"***42\"","format(\"{0:*>5}\", 42ull)",(char (*) [6])"***42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0xc045000000000000;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_08.size_ = 7;
  format_str_08.data_ = "{0:*>5}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_08,args_08,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**-42\"","format(\"{0:*>5}\", -42.0)",(char (*) [6])"**-42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0xa800000000000000;
  local_2e8._M_string_length._0_2_ = 0xc004;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_09.size_ = 7;
  format_str_09.data_ = "{0:*>5}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_09,args_09,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**-42\"","format(\"{0:*>5}\", -42.0l)",(char (*) [6])"**-42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0x63;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_10.size_ = 7;
  format_str_10.data_ = "{0:*<5}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_10,args_10,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"c****\"","format(\"{0:*<5}\", \'c\')",(char (*) [6])"c****",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3af,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = "abc";
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_11.size_ = 7;
  format_str_11.data_ = "{0:*<5}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_11,args_11,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2f8,"\"abc**\"","format(\"{0:*<5}\", \"abc\")",(char (*) [6])"abc**"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = (pointer)0xface;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_12.size_ = 7;
  format_str_12.data_ = "{0:*>8}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_12,args_12,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_2f8,"\"**0xface\"",
             "format(\"{0:*>8}\", reinterpret_cast<void*>(0xface))",(char (*) [9])"**0xface",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2e8._M_dataplus._M_p = "foo";
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_13.size_ = 4;
  format_str_13.data_ = "{:}=";
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2e8;
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
       ::TYPES;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_13,args_13,(locale_ref)0x0);
  local_318._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_2f8,"\"foo=\"","format(\"{:}=\", \"foo\")",(char (*) [5])"foo=",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_2f8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_2f0._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_2f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318._16_4_ = 0x2a000000;
  local_318._8_8_ = 4;
  local_318[0x14] = '\0';
  local_2f8 = 0x2a;
  lStack_2b0 = 0;
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_2a8 = 500;
  format_str_14.size_ = 6;
  format_str_14.data_ = "{:";
  args_14.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2f8;
  args_14.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
       ::TYPES;
  local_318._0_8_ = pAVar1;
  local_2b8 = local_2a0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2c0,format_str_14,args_14,(locale_ref)0x0);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,local_2b8,local_2b8 + lStack_2b0);
  local_2c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_2b8 != local_2a0) {
    operator_delete(local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a8,"std::string(\"\\0\\0\\0*\", 4)","format(string_view(\"{:\\0>4}\", 6), \'*\')"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
             &local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_318._0_8_ != pAVar1) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c0);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_318,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_318);
    if (local_2c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_2c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_2c0.ptr_ + 8))();
      }
      local_2c0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, Fill) {
  EXPECT_THROW_MSG(format("{0:{<5}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_THROW_MSG(format("{0:{<5}}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_EQ("**42", format("{0:*>4}", 42));
  EXPECT_EQ("**-42", format("{0:*>5}", -42));
  EXPECT_EQ("***42", format("{0:*>5}", 42u));
  EXPECT_EQ("**-42", format("{0:*>5}", -42l));
  EXPECT_EQ("***42", format("{0:*>5}", 42ul));
  EXPECT_EQ("**-42", format("{0:*>5}", -42ll));
  EXPECT_EQ("***42", format("{0:*>5}", 42ull));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0l));
  EXPECT_EQ("c****", format("{0:*<5}", 'c'));
  EXPECT_EQ("abc**", format("{0:*<5}", "abc"));
  EXPECT_EQ("**0xface", format("{0:*>8}", reinterpret_cast<void*>(0xface)));
  EXPECT_EQ("foo=", format("{:}=", "foo"));
  EXPECT_EQ(std::string("\0\0\0*", 4), format(string_view("{:\0>4}", 6), '*'));
}